

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.c
# Opt level: O0

void icetDataReplicationGroup(IceTInt size,IceTInt *processes)

{
  bool bVar1;
  int local_24;
  IceTInt i;
  IceTBoolean found_myself;
  IceTInt *pIStack_18;
  IceTInt rank;
  IceTInt *processes_local;
  IceTInt size_local;
  
  bVar1 = false;
  pIStack_18 = processes;
  processes_local._4_4_ = size;
  icetGetIntegerv(2,&i);
  local_24 = 0;
  do {
    if (processes_local._4_4_ <= local_24) {
LAB_001109e3:
      if (bVar1) {
        icetStateSetIntegerv(0x2d,1,(IceTInt *)((long)&processes_local + 4));
        icetStateSetIntegerv(0x2c,processes_local._4_4_,pIStack_18);
      }
      else {
        icetRaiseDiagnostic("Local process not part of data replication group.",0xfffffffa,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/draw.c"
                            ,0x7e);
      }
      return;
    }
    if (pIStack_18[local_24] == i) {
      bVar1 = true;
      goto LAB_001109e3;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void icetDataReplicationGroup(IceTInt size, const IceTInt *processes)
{
    IceTInt rank;
    IceTBoolean found_myself = ICET_FALSE;
    IceTInt i;

    icetGetIntegerv(ICET_RANK, &rank);
    for (i = 0; i < size; i++) {
        if (processes[i] == rank) {
            found_myself = ICET_TRUE;
            break;
        }
    }

    if (!found_myself) {
        icetRaiseError("Local process not part of data replication group.",
                       ICET_INVALID_VALUE);
        return;
    }

    icetStateSetIntegerv(ICET_DATA_REPLICATION_GROUP_SIZE, 1, &size);
    icetStateSetIntegerv(ICET_DATA_REPLICATION_GROUP, size, processes);
}